

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O0

int __thiscall
sznet::net::SelectPoller::poll(SelectPoller *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  LogLevel extraout_EAX;
  LogLevel LVar2;
  LogLevel extraout_EAX_00;
  LogLevel extraout_EAX_01;
  LogLevel extraout_EAX_02;
  LogStream *pLVar3;
  int iVar4;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  undefined1 local_4018 [12];
  Logger local_4008;
  undefined1 local_3038 [12];
  Logger local_3028;
  undefined1 local_2058 [12];
  Logger local_2048;
  int local_1074;
  undefined1 auStack_1070 [4];
  int numEvents;
  timeval timeout;
  Event_t *elem;
  iterator __end2;
  iterator __begin2;
  PollFdList *__range2;
  sz_fd maxfd;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  undefined1 local_1000 [12];
  Logger local_ff0;
  int local_1c;
  pollfd *ppStack_18;
  int timeoutMs_local;
  ChannelList *activeChannels_local;
  SelectPoller *this_local;
  
  local_1c = (int)__nfds;
  ppStack_18 = __fds;
  activeChannels_local = (ChannelList *)this;
  bVar1 = std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
          empty(&this->m_pollfds);
  if (bVar1) {
    LVar2 = Logger::logLevel();
    if ((int)LVar2 < 1) {
      Logger::SourceFile::SourceFile<103>
                ((SourceFile *)local_1000,
                 (char (*) [103])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_1000._0_8_;
      file.m_size = local_1000._8_4_;
      Logger::Logger(&local_ff0,file,0x1a,TRACE,"poll");
      pLVar3 = Logger::stream(&local_ff0);
      LogStream::operator<<(pLVar3,"m_pollfds is empty, nothing happened");
      Logger::~Logger(&local_ff0);
      LVar2 = extraout_EAX;
    }
  }
  else {
    for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
      (this->m_rfds).fds_bits[(uint)__arr] = 0;
    }
    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
      (this->m_wfds).fds_bits[__arr_1._4_4_] = 0;
    }
    for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
      (this->m_efds).fds_bits[__arr_2._4_4_] = 0;
    }
    __range2._4_4_ = 0;
    __end2 = std::
             vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
             begin(&this->m_pollfds);
    elem = (Event_t *)
           std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
           ::end(&this->m_pollfds);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
                                       *)&elem), bVar1) {
      timeout.tv_usec =
           (__suseconds_t)
           __gnu_cxx::
           __normal_iterator<sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
           ::operator*(&__end2);
      if ((((reference)timeout.tv_usec)->ev & 1) != 0) {
        iVar4 = ((reference)timeout.tv_usec)->fd / 0x40;
        (this->m_rfds).fds_bits[iVar4] =
             1L << ((byte)((long)((reference)timeout.tv_usec)->fd % 0x40) & 0x3f) |
             (this->m_rfds).fds_bits[iVar4];
      }
      if ((((reference)timeout.tv_usec)->ev & 8) != 0) {
        iVar4 = ((reference)timeout.tv_usec)->fd / 0x40;
        (this->m_wfds).fds_bits[iVar4] =
             1L << ((byte)((long)((reference)timeout.tv_usec)->fd % 0x40) & 0x3f) |
             (this->m_wfds).fds_bits[iVar4];
      }
      iVar4 = ((reference)timeout.tv_usec)->fd / 0x40;
      (this->m_efds).fds_bits[iVar4] =
           1L << ((byte)((long)((reference)timeout.tv_usec)->fd % 0x40) & 0x3f) |
           (this->m_efds).fds_bits[iVar4];
      if (__range2._4_4_ < ((reference)timeout.tv_usec)->fd) {
        __range2._4_4_ = ((reference)timeout.tv_usec)->fd;
      }
      __gnu_cxx::
      __normal_iterator<sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
      ::operator++(&__end2);
    }
    _auStack_1070 = (long)(local_1c / 1000);
    timeout.tv_sec = (__time_t)((local_1c % 1000) * 1000);
    local_1074 = select(__range2._4_4_ + 1,(fd_set *)&this->m_rfds,(fd_set *)&this->m_wfds,
                        (fd_set *)&this->m_efds,(timeval *)auStack_1070);
    if (local_1074 < 1) {
      if (local_1074 == 0) {
        LVar2 = Logger::logLevel();
        if ((int)LVar2 < 1) {
          Logger::SourceFile::SourceFile<103>
                    ((SourceFile *)local_3038,
                     (char (*) [103])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    );
          file_01._12_4_ = 0;
          file_01.m_data = (char *)local_3038._0_8_;
          file_01.m_size = local_3038._8_4_;
          Logger::Logger(&local_3028,file_01,0x43,TRACE,"poll");
          pLVar3 = Logger::stream(&local_3028);
          LogStream::operator<<(pLVar3,"nothing happened");
          Logger::~Logger(&local_3028);
          LVar2 = extraout_EAX_01;
        }
      }
      else {
        LVar2 = sz_getlasterr();
        if (LVar2 != ERROR) {
          Logger::SourceFile::SourceFile<103>
                    ((SourceFile *)local_4018,
                     (char (*) [103])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    );
          file_02._12_4_ = 0;
          file_02.m_data = (char *)local_4018._0_8_;
          file_02.m_size = local_4018._8_4_;
          Logger::Logger(&local_4008,file_02,0x49,false);
          pLVar3 = Logger::stream(&local_4008);
          LogStream::operator<<(pLVar3,"SelectPoller::poll()");
          Logger::~Logger(&local_4008);
          LVar2 = extraout_EAX_02;
        }
      }
    }
    else {
      LVar2 = Logger::logLevel();
      if ((int)LVar2 < 1) {
        Logger::SourceFile::SourceFile<103>
                  ((SourceFile *)local_2058,
                   (char (*) [103])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  );
        file_00._12_4_ = 0;
        file_00.m_data = (char *)local_2058._0_8_;
        file_00.m_size = local_2058._8_4_;
        Logger::Logger(&local_2048,file_00,0x3e,TRACE,"poll");
        pLVar3 = Logger::stream(&local_2048);
        pLVar3 = LogStream::operator<<(pLVar3,local_1074);
        LogStream::operator<<(pLVar3," events happened");
        Logger::~Logger(&local_2048);
      }
      fillActiveChannels(this,local_1074,(ChannelList *)ppStack_18);
      LVar2 = extraout_EAX_00;
    }
  }
  return LVar2;
}

Assistant:

void SelectPoller::poll(ChannelList* activeChannels, int timeoutMs)
{
	if (m_pollfds.empty())
	{
		LOG_TRACE << "m_pollfds is empty, nothing happened";
		return;
	}

	FD_ZERO(&m_rfds);
	FD_ZERO(&m_wfds);
	FD_ZERO(&m_efds);
	sockets::sz_fd maxfd = 0;
	for (const auto& elem : m_pollfds)
	{
		if (elem.ev & Channel::kNoneEvent)
		{
			continue;
		}
		if (elem.ev & Channel::kReadEvent)
		{
			FD_SET(elem.fd, &m_rfds);
		}
		if (elem.ev & Channel::kWriteEvent)
		{
			FD_SET(elem.fd, &m_wfds);
		}
		FD_SET(elem.fd, &m_efds);
		if (elem.fd > maxfd)
		{
			maxfd = elem.fd;
		}
	}

	timeval timeout;
	timeout.tv_sec = timeoutMs / 1000;
	timeout.tv_usec = static_cast<int>(timeoutMs % 1000) * 1000;
	int numEvents = select(static_cast<int>(maxfd + 1), &m_rfds, &m_wfds, &m_efds, &timeout);

	if (numEvents > 0)
	{
		LOG_TRACE << numEvents << " events happened";
		fillActiveChannels(numEvents, activeChannels);
	}
	else if (numEvents == 0)
	{
		LOG_TRACE << "nothing happened";
	}
	else
	{
		if (sz_getlasterr() != sz_err_eintr)
		{
			LOG_SYSERR << "SelectPoller::poll()";
		}
	}
	return;
}